

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

unsigned_long flatbuffers::JsonPrinter::GetFieldDefault<unsigned_long>(FieldDef *fd)

{
  bool bVar1;
  char *str;
  unsigned_long uStack_18;
  bool check;
  unsigned_long val;
  FieldDef *fd_local;
  
  uStack_18 = 0;
  val = (unsigned_long)fd;
  str = (char *)std::__cxx11::string::c_str();
  bVar1 = StringToNumber<unsigned_long>(str,&stack0xffffffffffffffe8);
  if (bVar1) {
    return uStack_18;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = unsigned long]"
               );
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }